

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DGlow2::Tick(DGlow2 *this)

{
  int iVar1;
  int temp;
  DGlow2 *this_local;
  
  iVar1 = this->m_Tics;
  this->m_Tics = iVar1 + 1;
  if (this->m_MaxTics <= iVar1) {
    if ((this->m_OneShot & 1U) != 0) {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_End);
      (*(this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])()
      ;
      return;
    }
    iVar1 = this->m_Start;
    this->m_Start = this->m_End;
    this->m_End = iVar1;
    this->m_Tics = this->m_Tics - this->m_MaxTics;
  }
  sector_t::SetLightLevel
            ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,
             ((this->m_End - this->m_Start) * this->m_Tics) / this->m_MaxTics + this->m_Start);
  return;
}

Assistant:

void DGlow2::Tick ()
{
	if (m_Tics++ >= m_MaxTics)
	{
		if (m_OneShot)
		{
			m_Sector->SetLightLevel(m_End);
			Destroy ();
			return;
		}
		else
		{
			int temp = m_Start;
			m_Start = m_End;
			m_End = temp;
			m_Tics -= m_MaxTics;
		}
	}

	m_Sector->SetLightLevel(((m_End - m_Start) * m_Tics) / m_MaxTics + m_Start);
}